

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::QFileSystemNode
          (QFileSystemNode *this,QString *filename,QFileSystemNode *p)

{
  QArrayDataPointer<char16_t>::QArrayDataPointer((QArrayDataPointer<char16_t> *)this,&filename->d);
  (this->visibleChildren).d.ptr = (QString *)0x0;
  (this->visibleChildren).d.size = 0;
  (this->children).d = (Data *)0x0;
  (this->visibleChildren).d.d = (Data *)0x0;
  this->info = (QExtendedInformation *)0x0;
  this->parent = p;
  this->dirtyChildrenIndex = -1;
  this->populatedChildren = false;
  this->isVisible = false;
  return;
}

Assistant:

explicit QFileSystemNode(const QString &filename = QString(), QFileSystemNode *p = nullptr)
            : fileName(filename), parent(p) {}